

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGjkEpa2.cpp
# Opt level: O1

sFace * __thiscall gjkepa2_impl::EPA::newface(EPA *this,sSV *a,sSV *b,sSV *c,bool forced)

{
  btScalar *dist;
  U *pUVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  sFace *face;
  sFace *psVar4;
  undefined1 auVar5 [16];
  bool bVar6;
  _ _Var7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  face = (this->m_stock).root;
  if (face == (sFace *)0x0) {
    this->m_status = OutOfFaces;
  }
  else {
    if (face->l[1] != (sFace *)0x0) {
      face->l[1]->l[0] = face->l[0];
    }
    if (face->l[0] != (sFace *)0x0) {
      face->l[0]->l[1] = face->l[1];
    }
    if ((this->m_stock).root == face) {
      (this->m_stock).root = face->l[1];
    }
    pUVar1 = &(this->m_stock).count;
    *pUVar1 = *pUVar1 - 1;
    face->l[0] = (sFace *)0x0;
    face->l[1] = (this->m_hull).root;
    psVar4 = (this->m_hull).root;
    if (psVar4 != (sFace *)0x0) {
      psVar4->l[0] = face;
    }
    (this->m_hull).root = face;
    pUVar1 = &(this->m_hull).count;
    *pUVar1 = *pUVar1 + 1;
    face->pass = '\0';
    face->c[0] = a;
    face->c[1] = b;
    face->c[2] = c;
    fVar13 = (a->w).m_floats[0];
    fVar8 = (b->w).m_floats[0] - fVar13;
    uVar2 = *(undefined8 *)((b->w).m_floats + 1);
    uVar3 = *(undefined8 *)((a->w).m_floats + 1);
    fVar11 = (float)uVar3;
    fVar9 = (float)uVar2 - fVar11;
    fVar12 = (float)((ulong)uVar3 >> 0x20);
    fVar10 = (float)((ulong)uVar2 >> 0x20) - fVar12;
    fVar11 = (c->w).m_floats[1] - fVar11;
    fVar12 = (c->w).m_floats[2] - fVar12;
    fVar13 = (c->w).m_floats[0] - fVar13;
    auVar5._4_4_ = fVar10 * fVar13 - fVar12 * fVar8;
    auVar5._0_4_ = fVar9 * fVar12 - fVar11 * fVar10;
    auVar5._8_4_ = fVar8 * fVar11 - fVar13 * fVar9;
    auVar5._12_4_ = 0;
    *(undefined1 (*) [16])(face->n).m_floats = auVar5;
    fVar13 = (face->n).m_floats[0];
    fVar8 = (face->n).m_floats[1];
    fVar9 = (face->n).m_floats[2];
    fVar13 = fVar9 * fVar9 + fVar13 * fVar13 + fVar8 * fVar8;
    if (fVar13 < 0.0) {
      fVar13 = sqrtf(fVar13);
    }
    else {
      fVar13 = SQRT(fVar13);
    }
    _Var7 = Degenerated;
    if (0.0001 < fVar13) {
      dist = &face->d;
      bVar6 = getedgedist(this,face,a,b,dist);
      if (((!bVar6) && (bVar6 = getedgedist(this,face,b,c,dist), !bVar6)) &&
         (bVar6 = getedgedist(this,face,c,a,dist), !bVar6)) {
        face->d = ((a->w).m_floats[2] * (face->n).m_floats[2] +
                  (a->w).m_floats[0] * (face->n).m_floats[0] +
                  (a->w).m_floats[1] * (face->n).m_floats[1]) / fVar13;
      }
      fVar13 = 1.0 / fVar13;
      uVar2 = *(undefined8 *)(face->n).m_floats;
      *(ulong *)(face->n).m_floats =
           CONCAT44(fVar13 * (float)((ulong)uVar2 >> 0x20),fVar13 * (float)uVar2);
      (face->n).m_floats[2] = fVar13 * (face->n).m_floats[2];
      if (forced) {
        return face;
      }
      _Var7 = NonConvex;
      if (-1e-05 <= *dist) {
        return face;
      }
    }
    this->m_status = _Var7;
    if (face->l[1] != (sFace *)0x0) {
      face->l[1]->l[0] = face->l[0];
    }
    if (face->l[0] != (sFace *)0x0) {
      face->l[0]->l[1] = face->l[1];
    }
    if ((this->m_hull).root == face) {
      (this->m_hull).root = face->l[1];
    }
    pUVar1 = &(this->m_hull).count;
    *pUVar1 = *pUVar1 - 1;
    face->l[0] = (sFace *)0x0;
    face->l[1] = (this->m_stock).root;
    psVar4 = (this->m_stock).root;
    if (psVar4 != (sFace *)0x0) {
      psVar4->l[0] = face;
    }
    (this->m_stock).root = face;
    pUVar1 = &(this->m_stock).count;
    *pUVar1 = *pUVar1 + 1;
  }
  return (sFace *)0x0;
}

Assistant:

sFace*				newface(sSV* a,sSV* b,sSV* c,bool forced)
			{
				if(m_stock.root)
				{
					sFace*	face=m_stock.root;
					remove(m_stock,face);
					append(m_hull,face);
					face->pass	=	0;
					face->c[0]	=	a;
					face->c[1]	=	b;
					face->c[2]	=	c;
					face->n		=	btCross(b->w-a->w,c->w-a->w);
					const btScalar	l=face->n.length();
					const bool		v=l>EPA_ACCURACY;

					if(v)
					{
						if(!(getedgedist(face, a, b, face->d) ||
							 getedgedist(face, b, c, face->d) ||
							 getedgedist(face, c, a, face->d)))
						{
							// Origin projects to the interior of the triangle
							// Use distance to triangle plane
							face->d = btDot(a->w, face->n) / l;
						}

						face->n /= l;
						if(forced || (face->d >= -EPA_PLANE_EPS))
						{
							return face;
						}
						else
							m_status=eStatus::NonConvex;
					}
					else
						m_status=eStatus::Degenerated;

					remove(m_hull, face);
					append(m_stock, face);
					return 0;

				}
				m_status = m_stock.root ? eStatus::OutOfVertices : eStatus::OutOfFaces;
				return 0;
			}